

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QPointF>::reallocate
          (QPodArrayOps<QPointF> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QPointF>_*,_QPointF_*> pVar1;
  
  pVar1 = QTypedArrayData<QPointF>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QPointF>).d,
                     (this->super_QArrayDataPointer<QPointF>).ptr,alloc,option);
  (this->super_QArrayDataPointer<QPointF>).d = pVar1.first;
  (this->super_QArrayDataPointer<QPointF>).ptr = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }